

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Json1Init(sqlite3 *db)

{
  int iVar1;
  int *p;
  long lVar2;
  ulong uVar3;
  
  p = &sqlite3Json1Init::aFunc[0].flag;
  uVar3 = 0;
  do {
    iVar1 = createFunctionApi(db,((anon_struct_24_4_154ec7fe *)(p + -3))->zName,p[-1],0x801,p,
                              *(_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **)(p + 1),
                              (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                              (_func_void_sqlite3_context_ptr *)0x0,
                              (_func_void_sqlite3_context_ptr *)0x0,
                              (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                              (_func_void_void_ptr *)0x0);
    if (0xd < uVar3) break;
    uVar3 = uVar3 + 1;
    p = p + 6;
  } while (iVar1 == 0);
  if (iVar1 == 0) {
    lVar2 = 0;
    do {
      iVar1 = createFunctionApi(db,*(char **)((long)&sqlite3Json1Init::aAgg[0].zName + lVar2),
                                *(int *)((long)&sqlite3Json1Init::aAgg[0].nArg + lVar2),0x801,
                                (void *)0x0,
                                (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                                *(_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **)
                                 ((long)&sqlite3Json1Init::aAgg[0].xStep + lVar2),
                                *(_func_void_sqlite3_context_ptr **)
                                 ((long)&sqlite3Json1Init::aAgg[0].xFinal + lVar2),
                                *(_func_void_sqlite3_context_ptr **)
                                 ((long)&sqlite3Json1Init::aAgg[0].xValue + lVar2),jsonGroupInverse,
                                (_func_void_void_ptr *)0x0);
      if (lVar2 != 0) break;
      lVar2 = 0x28;
    } while (iVar1 == 0);
  }
  if (iVar1 == 0) {
    lVar2 = 0;
    do {
      iVar1 = createModule(db,*(char **)((long)&sqlite3Json1Init::aMod[0].zName + lVar2),
                           *(sqlite3_module **)((long)&sqlite3Json1Init::aMod[0].pModule + lVar2),
                           (void *)0x0,(_func_void_void_ptr *)0x0);
      if (lVar2 != 0) {
        return iVar1;
      }
      lVar2 = 0x10;
    } while (iVar1 == 0);
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3Json1Init(sqlite3 *db){
  int rc = SQLITE_OK;
  unsigned int i;
  static const struct {
     const char *zName;
     int nArg;
     int flag;
     void (*xFunc)(sqlite3_context*,int,sqlite3_value**);
  } aFunc[] = {
    { "json",                 1, 0,   jsonRemoveFunc        },
    { "json_array",          -1, 0,   jsonArrayFunc         },
    { "json_array_length",    1, 0,   jsonArrayLengthFunc   },
    { "json_array_length",    2, 0,   jsonArrayLengthFunc   },
    { "json_extract",        -1, 0,   jsonExtractFunc       },
    { "json_insert",         -1, 0,   jsonSetFunc           },
    { "json_object",         -1, 0,   jsonObjectFunc        },
    { "json_patch",           2, 0,   jsonPatchFunc         },
    { "json_quote",           1, 0,   jsonQuoteFunc         },
    { "json_remove",         -1, 0,   jsonRemoveFunc        },
    { "json_replace",        -1, 0,   jsonReplaceFunc       },
    { "json_set",            -1, 1,   jsonSetFunc           },
    { "json_type",            1, 0,   jsonTypeFunc          },
    { "json_type",            2, 0,   jsonTypeFunc          },
    { "json_valid",           1, 0,   jsonValidFunc         },

#if SQLITE_DEBUG
    /* DEBUG and TESTING functions */
    { "json_parse",           1, 0,   jsonParseFunc         },
    { "json_test1",           1, 0,   jsonTest1Func         },
#endif
  };
  static const struct {
     const char *zName;
     int nArg;
     void (*xStep)(sqlite3_context*,int,sqlite3_value**);
     void (*xFinal)(sqlite3_context*);
     void (*xValue)(sqlite3_context*);
  } aAgg[] = {
    { "json_group_array",     1,
      jsonArrayStep,   jsonArrayFinal,  jsonArrayValue  },
    { "json_group_object",    2,
      jsonObjectStep,  jsonObjectFinal, jsonObjectValue },
  };
#ifndef SQLITE_OMIT_VIRTUALTABLE
  static const struct {
     const char *zName;
     sqlite3_module *pModule;
  } aMod[] = {
    { "json_each",            &jsonEachModule               },
    { "json_tree",            &jsonTreeModule               },
  };
#endif
  for(i=0; i<sizeof(aFunc)/sizeof(aFunc[0]) && rc==SQLITE_OK; i++){
    rc = sqlite3_create_function(db, aFunc[i].zName, aFunc[i].nArg,
                                 SQLITE_UTF8 | SQLITE_DETERMINISTIC, 
                                 (void*)&aFunc[i].flag,
                                 aFunc[i].xFunc, 0, 0);
  }
#ifndef SQLITE_OMIT_WINDOWFUNC
  for(i=0; i<sizeof(aAgg)/sizeof(aAgg[0]) && rc==SQLITE_OK; i++){
    rc = sqlite3_create_window_function(db, aAgg[i].zName, aAgg[i].nArg,
                                 SQLITE_UTF8 | SQLITE_DETERMINISTIC, 0,
                                 aAgg[i].xStep, aAgg[i].xFinal,
                                 aAgg[i].xValue, jsonGroupInverse, 0);
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  for(i=0; i<sizeof(aMod)/sizeof(aMod[0]) && rc==SQLITE_OK; i++){
    rc = sqlite3_create_module(db, aMod[i].zName, aMod[i].pModule, 0);
  }
#endif
  return rc;
}